

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall
sznet::Logger::Impl::Impl(Impl *this,LogLevel level,int savedErrno,SourceFile *file,int line)

{
  int iVar1;
  undefined4 uVar2;
  uint len;
  Timestamp TVar3;
  char *pcVar4;
  self *psVar5;
  LogStream *pLVar6;
  T local_58;
  T local_48;
  int local_34;
  
  local_34 = savedErrno;
  TVar3 = Timestamp::now();
  pLVar6 = &this->m_stream;
  (this->m_time).m_microSecondsSinceEpoch = TVar3.m_microSecondsSinceEpoch;
  memset(pLVar6,0,0xfa8);
  (this->m_stream).m_buffer.m_cur = (this->m_stream).m_buffer.m_data;
  this->m_level = level;
  this->m_line = line;
  iVar1 = file->m_size;
  uVar2 = *(undefined4 *)&file->field_0xc;
  (this->m_basename).m_data = file->m_data;
  (this->m_basename).m_size = iVar1;
  *(undefined4 *)&(this->m_basename).field_0xc = uVar2;
  formatTime(this);
  CurrentThread::tid();
  pcVar4 = (char *)CurrentThread::t_tidString();
  len = CurrentThread::tidStringLength();
  T::T(&local_58,pcVar4,len);
  LogStream::append(pLVar6,local_58.m_str,local_58.m_len);
  T::T(&local_48,*(char **)(LogLevelName + (ulong)level * 8),6);
  iVar1 = local_34;
  LogStream::append(pLVar6,local_48.m_str,local_48.m_len);
  if (iVar1 != 0) {
    pcVar4 = sz_strerror_tl(iVar1);
    psVar5 = LogStream::operator<<(pLVar6,pcVar4);
    psVar5 = LogStream::operator<<(psVar5," (errno=");
    pLVar6 = LogStream::operator<<(psVar5,iVar1);
    LogStream::operator<<(pLVar6,") ");
  }
  return;
}

Assistant:

Logger::Impl::Impl(LogLevel level, int savedErrno, const SourceFile& file, int line): 
	m_time(Timestamp::now()),
	m_stream(),
	m_level(level),
	m_line(line),
	m_basename(file)
{
	// 写入时间字符串
	formatTime();
	// 尝试获取线程id
	CurrentThread::tid();
	// 写入线程id字符串
	m_stream << T(CurrentThread::tidString(), CurrentThread::tidStringLength());
	// 写入日志等级字符串
	m_stream << T(LogLevelName[level], 6);
	// 有errno，写入错误原因
	if (savedErrno != 0)
	{
		m_stream << sz_strerror_tl(savedErrno) << " (errno=" << savedErrno << ") ";
	}
}